

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O2

void polymul_internal::polynomial_multiplier<double,_4,_0,_3>::mul_monomial
               (double *dst,double *p1,double *m2)

{
  double dVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = binomial(6,2);
  lVar3 = (long)iVar2;
  while( true ) {
    iVar2 = binomial(7,3);
    if (iVar2 <= lVar3) break;
    dVar1 = *p1;
    iVar2 = binomial(6,2);
    dst[lVar3] = dVar1 * m2[lVar3 - iVar2] + dst[lVar3];
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

static void mul_monomial(numtype POLYMUL_RESTRICT dst[],
                           const numtype p1[],
                           const numtype m2[]) {
    for (int i = binomial(Nvar + Ndeg2 - 1, Ndeg2 - 1);
         i < binomial(Nvar + Ndeg2, Ndeg2);
         i++)
      dst[i] += p1[0] * m2[i - binomial(Nvar + Ndeg2 - 1, Ndeg2 - 1)];
  }